

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O3

void __thiscall
bloom_tests::merkle_block_2_with_update_none::test_method(merkle_block_2_with_update_none *this)

{
  uint256 *puVar1;
  uchar *puVar2;
  bool bVar3;
  pointer puVar4;
  pointer ppVar5;
  pointer ppVar6;
  long lVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  pointer puVar10;
  iterator in_R8;
  iterator pvVar11;
  iterator in_R9;
  iterator pvVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  byte bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  Span<const_std::byte> sp;
  Span<const_unsigned_char> vKey;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  Span<const_unsigned_char> vKey_00;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  vector<uint256,_std::allocator<uint256>_> vMatched;
  DataStream stream;
  CBloomFilter filter;
  pair<unsigned_int,_uint256> pair;
  check_type cVar37;
  undefined1 *local_b10;
  undefined1 *local_b08;
  char *local_b00;
  char *local_af8;
  char *local_af0;
  char *local_ae8;
  undefined1 *local_ae0;
  undefined1 *local_ad8;
  char *local_ad0;
  char *local_ac8;
  char *local_ac0;
  char *local_ab8;
  undefined1 *local_ab0;
  undefined1 *local_aa8;
  char *local_aa0;
  char *local_a98;
  char *local_a90;
  char *local_a88;
  undefined1 *local_a80;
  undefined1 *local_a78;
  char *local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a58;
  undefined1 *local_a50;
  undefined1 *local_a48;
  char *local_a40;
  char *local_a38;
  char *local_a30;
  char *local_a28;
  undefined1 *local_a20;
  undefined1 *local_a18;
  char *local_a10;
  char *local_a08;
  char *local_a00;
  char *local_9f8;
  undefined1 *local_9f0;
  undefined1 *local_9e8;
  char *local_9e0;
  char *local_9d8;
  char *local_9d0;
  char *local_9c8;
  undefined1 *local_9c0;
  undefined1 *local_9b8;
  char *local_9b0;
  char *local_9a8;
  char *local_9a0;
  char *local_998;
  undefined1 *local_990;
  undefined1 *local_988;
  char *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  assertion_result local_950;
  char **local_938;
  assertion_result local_930;
  undefined1 *local_918;
  undefined1 *local_910;
  char *local_908;
  char *local_900;
  char *local_8f8;
  char *local_8f0;
  undefined1 *local_8e8;
  undefined1 *local_8e0;
  char *local_8d8;
  char *local_8d0;
  char *local_8c8;
  char *local_8c0;
  undefined1 *local_8b8;
  undefined1 *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  undefined1 *local_888;
  undefined1 *local_880;
  char *local_878;
  char *local_870;
  undefined1 local_868 [16];
  pointer local_858;
  vector<uint256,_std::allocator<uint256>_> local_848;
  char *local_830;
  char *local_828;
  undefined1 *local_820;
  undefined1 *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  undefined1 *local_7f0;
  undefined1 *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  DataStream local_770;
  CBloomFilter local_750;
  undefined1 local_728 [16];
  undefined1 local_718 [9];
  uchar uStack_70f;
  uchar uStack_70e;
  uchar uStack_70d;
  uchar uStack_70c;
  uchar uStack_70b;
  uchar uStack_70a;
  uchar uStack_709;
  uint local_6d8;
  _Bit_type *local_6d0;
  uint uStack_6c8;
  _Bit_type *local_6c0;
  uint uStack_6b8;
  _Bit_pointer local_6b0;
  undefined1 local_6a8 [16];
  pointer local_698;
  bool local_690;
  undefined1 local_688 [16];
  pointer local_678;
  undefined1 local_668 [8];
  shared_ptr<boost::basic_wrap_stringstream<char>_> sStack_660;
  uchar uStack_650;
  uchar uStack_64f;
  uchar uStack_64e;
  uchar uStack_64d;
  uchar uStack_64c;
  uchar uStack_64b;
  uchar uStack_64a;
  uchar uStack_649;
  undefined4 local_648;
  undefined1 local_638 [8];
  shared_ptr<boost::basic_wrap_stringstream<char>_> sStack_630;
  undefined8 uStack_620;
  undefined1 local_618 [8];
  undefined8 uStack_610;
  uchar local_608 [64];
  CPartialMerkleTree local_5c8;
  pointer local_578;
  pointer ppStack_570;
  pointer local_568;
  undefined1 local_a8 [32];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [11];
  undefined5 uStack_4d;
  undefined1 auStack_48 [11];
  long local_38;
  
  local_930.m_message.pn.pi_ = (sp_counted_base *)local_930.m_message.px;
  bVar16 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  auStack_48 = SUB1611((undefined1  [16])0x0,5);
  local_58 = SUB1611((undefined1  [16])0x0,0);
  uStack_4d = 0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_a8._16_16_ = (undefined1  [16])0x0;
  local_a8._0_16_ = (undefined1  [16])0x0;
  memcpy(local_618,null_ARRAY_00e485c0,0x569);
  sp.m_size = 0x569;
  sp.m_data = local_618;
  DataStream::DataStream(&local_770,sp);
  local_618 = (undefined1  [8])&::TX_WITH_WITNESS;
  uStack_610 = &local_770;
  CBlock::SerializationOps<ParamsStream<DataStream&,TransactionSerParams>,CBlock,ActionUnserialize>
            (local_a8);
  CBloomFilter::CBloomFilter(&local_750,10,1e-06,0,'\0');
  local_618._0_4_ = -0x1346c490;
  local_618[4] = 'z';
  local_618[5] = 0xb4;
  local_618[6] = 0xf5;
  local_618[7] = 'm';
  uStack_610._0_1_ = 0x9e;
  uStack_610._1_1_ = 'A';
  uStack_610._2_1_ = 'z';
  uStack_610._3_1_ = 'S';
  uStack_610._4_1_ = 0xac;
  uStack_610._5_1_ = '\x19';
  uStack_610._6_1_ = 0xce;
  uStack_610._7_1_ = 0xf9;
  local_608[0] = 0xc5;
  local_608[1] = '5';
  local_608[2] = '\x13';
  local_608[3] = 0xdc;
  local_608[4] = '\x03';
  local_608[5] = 'R';
  local_608[6] = 0xb9;
  local_608[7] = 's';
  local_608[8] = 'N';
  local_608[9] = '\x01';
  local_608[10] = '-';
  local_608[0xb] = 'y';
  local_608[0xc] = 0x9f;
  local_608[0xd] = 0xfe;
  local_608[0xe] = 0x80;
  local_608[0xf] = 0xe9;
  vKey.m_size = 0x20;
  vKey.m_data = local_618;
  CBloomFilter::insert(&local_750,vKey);
  CMerkleBlock::CMerkleBlock
            ((CMerkleBlock *)local_618,(CBlock *)local_a8,&local_750,
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)0x0);
  local_780 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_778 = "";
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x11e;
  file.m_begin = (iterator)&local_780;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_790,msg);
  CBlockHeader::GetHash((uint256 *)local_728,(CBlockHeader *)local_618);
  CBlockHeader::GetHash((uint256 *)local_668,(CBlockHeader *)local_a8);
  auVar26[0] = -((uchar)sStack_660.pn.pi_ == local_718[0]);
  auVar26[1] = -(sStack_660.pn.pi_._1_1_ == local_718[1]);
  auVar26[2] = -(sStack_660.pn.pi_._2_1_ == local_718[2]);
  auVar26[3] = -(sStack_660.pn.pi_._3_1_ == local_718[3]);
  auVar26[4] = -(sStack_660.pn.pi_._4_1_ == local_718[4]);
  auVar26[5] = -(sStack_660.pn.pi_._5_1_ == local_718[5]);
  auVar26[6] = -(sStack_660.pn.pi_._6_1_ == local_718[6]);
  auVar26[7] = -(sStack_660.pn.pi_._7_1_ == local_718[7]);
  auVar26[8] = -(uStack_650 == local_718[8]);
  auVar26[9] = -(uStack_64f == uStack_70f);
  auVar26[10] = -(uStack_64e == uStack_70e);
  auVar26[0xb] = -(uStack_64d == uStack_70d);
  auVar26[0xc] = -(uStack_64c == uStack_70c);
  auVar26[0xd] = -(uStack_64b == uStack_70b);
  auVar26[0xe] = -(uStack_64a == uStack_70a);
  auVar26[0xf] = -(uStack_649 == uStack_709);
  auVar21[0] = -(local_668[0] == (readonly_property<bool>)local_728[0]);
  auVar21[1] = -(local_668[1] == local_728[1]);
  auVar21[2] = -(local_668[2] == local_728[2]);
  auVar21[3] = -(local_668[3] == local_728[3]);
  auVar21[4] = -(local_668[4] == local_728[4]);
  auVar21[5] = -(local_668[5] == local_728[5]);
  auVar21[6] = -(local_668[6] == local_728[6]);
  auVar21[7] = -(local_668[7] == local_728[7]);
  auVar21[8] = -((uchar)sStack_660.px == local_728[8]);
  auVar21[9] = -(sStack_660.px._1_1_ == local_728[9]);
  auVar21[10] = -(sStack_660.px._2_1_ == local_728[10]);
  auVar21[0xb] = -(sStack_660.px._3_1_ == local_728[0xb]);
  auVar21[0xc] = -(sStack_660.px._4_1_ == local_728[0xc]);
  auVar21[0xd] = -(sStack_660.px._5_1_ == local_728[0xd]);
  auVar21[0xe] = -(sStack_660.px._6_1_ == local_728[0xe]);
  auVar21[0xf] = -(sStack_660.px._7_1_ == local_728[0xf]);
  auVar21 = auVar21 & auVar26;
  local_950.m_message.px = (element_type *)0x0;
  local_950.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xe47831;
  local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe47860;
  sStack_630.px = (element_type *)(sStack_630._1_8_ << 8);
  local_638 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  sStack_630.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_798 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  uStack_620 = (assertion_result *)&local_848;
  local_950.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff);
  boost::test_tools::tt_detail::report_assertion
            (&local_950,(lazy_ostream *)local_638,1,0,WARN,_cVar37,(size_t)&local_7a0,0x11e);
  boost::detail::shared_count::~shared_count(&local_950.m_message.pn);
  local_7b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_7a8 = "";
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x120;
  file_00.m_begin = (iterator)&local_7b0;
  msg_00.m_end = pvVar12;
  msg_00.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_7c0,
             msg_00);
  local_668[0] = (readonly_property<bool>)
                 (readonly_property<bool>)((long)ppStack_570 - (long)local_578 == 0x24);
  sStack_660.px = (element_type *)0x0;
  sStack_660.pn.pi_ = (sp_counted_base *)0x0;
  local_638 = (undefined1  [8])0xe4794e;
  sStack_630.px = (element_type *)0xe47971;
  local_728[8] = 0;
  local_728._0_8_ = &PTR__lazy_ostream_01389048;
  stack0xfffffffffffff8f0 = (lazy_ostream *)local_638;
  local_718._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_7d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_7c8 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_668,(lazy_ostream *)local_728,1,0,WARN,_cVar37,
             (size_t)&local_7d0,0x120);
  boost::detail::shared_count::~shared_count(&sStack_660.pn);
  local_668 = *(undefined1 (*) [8])local_578;
  sStack_660 = *(shared_ptr<boost::basic_wrap_stringstream<char>_> *)
                ((local_578->second).super_base_blob<256U>.m_data._M_elems + 4);
  _uStack_650 = *(undefined8 *)((local_578->second).super_base_blob<256U>.m_data._M_elems + 0x14);
  local_648 = *(undefined4 *)((local_578->second).super_base_blob<256U>.m_data._M_elems + 0x1c);
  local_7e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_7d8 = "";
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x123;
  file_01.m_begin = (iterator)&local_7e0;
  msg_01.m_end = pvVar12;
  msg_01.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_7f0,
             msg_01);
  local_728._0_8_ = _DAT_00e47100;
  local_728[8] = UNK_00e47108;
  local_728._9_7_ = _UNK_00e47109;
  _local_718 = _DAT_00e47110;
  auVar22[0] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x10] == DAT_00e47110);
  auVar22[1] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x11] ==
                DAT_00e47110._1_1_);
  auVar22[2] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x12] ==
                DAT_00e47110._2_1_);
  auVar22[3] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x13] ==
                DAT_00e47110._3_1_);
  auVar22[4] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x14] ==
                DAT_00e47110._4_1_);
  auVar22[5] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x15] ==
                DAT_00e47110._5_1_);
  auVar22[6] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x16] ==
                DAT_00e47110._6_1_);
  auVar22[7] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x17] ==
                DAT_00e47110._7_1_);
  auVar22[8] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x18] ==
                DAT_00e47110._8_1_);
  auVar22[9] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x19] ==
                DAT_00e47110._9_1_);
  auVar22[10] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 DAT_00e47110._10_1_);
  auVar22[0xb] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  DAT_00e47110._11_1_);
  auVar22[0xc] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  DAT_00e47110._12_1_);
  auVar22[0xd] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  DAT_00e47110._13_1_);
  auVar22[0xe] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  DAT_00e47110._14_1_);
  auVar22[0xf] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  DAT_00e47110._15_1_);
  auVar17[0] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0] == DAT_00e47100);
  auVar17[1] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[1] == DAT_00e47100._1_1_)
  ;
  auVar17[2] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[2] == DAT_00e47100._2_1_)
  ;
  auVar17[3] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[3] == DAT_00e47100._3_1_)
  ;
  auVar17[4] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[4] == DAT_00e47100._4_1_)
  ;
  auVar17[5] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[5] == DAT_00e47100._5_1_)
  ;
  auVar17[6] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[6] == DAT_00e47100._6_1_)
  ;
  auVar17[7] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[7] == DAT_00e47100._7_1_)
  ;
  auVar17[8] = -((bool)(local_578->second).super_base_blob<256U>.m_data._M_elems[8] ==
                DAT_00e47100._8_1_);
  auVar17[9] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[9] == DAT_00e47100._9_1_)
  ;
  auVar17[10] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[10] ==
                 DAT_00e47100._10_1_);
  auVar17[0xb] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0xb] ==
                  DAT_00e47100._11_1_);
  auVar17[0xc] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0xc] ==
                  DAT_00e47100._12_1_);
  auVar17[0xd] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0xd] ==
                  DAT_00e47100._13_1_);
  auVar17[0xe] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0xe] ==
                  DAT_00e47100._14_1_);
  auVar17[0xf] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0xf] ==
                  DAT_00e47100._15_1_);
  auVar17 = auVar17 & auVar22;
  local_950.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff);
  local_950.m_message.px = (element_type *)0x0;
  local_950.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)"";
  local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)
             "merkleBlock.vMatchedTxn[0].second == uint256{\"e980fe9f792d014e73b95203dc1335c5f9ce19ac537a419e6df5b47aecb93b70\"}"
  ;
  sStack_630.px = (element_type *)(sStack_630._1_8_ << 8);
  local_638 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  sStack_630.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_800 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_7f8 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  uStack_620 = (assertion_result *)&local_848;
  boost::test_tools::tt_detail::report_assertion
            (&local_950,(lazy_ostream *)local_638,1,0,WARN,_cVar37,(size_t)&local_800,0x123);
  boost::detail::shared_count::~shared_count(&local_950.m_message.pn);
  local_810 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_808 = "";
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x124;
  file_02.m_begin = (iterator)&local_810;
  msg_02.m_end = pvVar12;
  msg_02.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_820,
             msg_02);
  local_638[0] = (class_property<bool>)(class_property<bool>)(local_578->first == 0);
  sStack_630.px = (element_type *)0x0;
  sStack_630.pn.pi_ = (sp_counted_base *)0x0;
  local_950._0_8_ = "merkleBlock.vMatchedTxn[0].first == 0";
  local_950.m_message.px = (element_type *)0xe47a08;
  local_728[8] = 0;
  local_728._0_8_ = &PTR__lazy_ostream_01389048;
  stack0xfffffffffffff8f0 = (lazy_ostream *)&local_950;
  local_718._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_830 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_828 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_638,(lazy_ostream *)local_728,1,0,WARN,_cVar37,
             (size_t)&local_830,0x124);
  boost::detail::shared_count::~shared_count(&sStack_630.pn);
  local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_858 = (pointer)0x0;
  local_868 = (undefined1  [16])0x0;
  local_878 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_870 = "";
  local_888 = &boost::unit_test::basic_cstring<char_const>::null;
  local_880 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x128;
  file_03.m_begin = (iterator)&local_878;
  msg_03.m_end = pvVar12;
  msg_03.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_888,
             msg_03);
  CPartialMerkleTree::ExtractMatches
            ((uint256 *)local_728,&local_5c8,&local_848,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_868);
  auVar23[0] = -((class_property<bool>)local_88[4] == local_728[0]);
  auVar23[1] = -(local_88[5] == local_728[1]);
  auVar23[2] = -(local_88[6] == local_728[2]);
  auVar23[3] = -(local_88[7] == local_728[3]);
  auVar23[4] = -(local_88[8] == local_728[4]);
  auVar23[5] = -(local_88[9] == local_728[5]);
  auVar23[6] = -(local_88[10] == local_728[6]);
  auVar23[7] = -(local_88[0xb] == local_728[7]);
  auVar23[8] = -(local_88[0xc] == local_728[8]);
  auVar23[9] = -(local_88[0xd] == local_728[9]);
  auVar23[10] = -(local_88[0xe] == local_728[10]);
  auVar23[0xb] = -(local_88[0xf] == local_728[0xb]);
  auVar23[0xc] = -(local_78[0] == local_728[0xc]);
  auVar23[0xd] = -(local_78[1] == local_728[0xd]);
  auVar23[0xe] = -(local_78[2] == local_728[0xe]);
  auVar23[0xf] = -(local_78[3] == local_728[0xf]);
  auVar27[0] = -(local_78[4] == local_718[0]);
  auVar27[1] = -(local_78[5] == local_718[1]);
  auVar27[2] = -(local_78[6] == local_718[2]);
  auVar27[3] = -(local_78[7] == local_718[3]);
  auVar27[4] = -(local_78[8] == local_718[4]);
  auVar27[5] = -(local_78[9] == local_718[5]);
  auVar27[6] = -(local_78[10] == local_718[6]);
  auVar27[7] = -(local_78[0xb] == local_718[7]);
  auVar27[8] = -(local_78[0xc] == local_718[8]);
  auVar27[9] = -(local_78[0xd] == uStack_70f);
  auVar27[10] = -(local_78[0xe] == uStack_70e);
  auVar27[0xb] = -(local_78[0xf] == uStack_70d);
  auVar27[0xc] = -(local_68[0] == uStack_70c);
  auVar27[0xd] = -(local_68[1] == uStack_70b);
  auVar27[0xe] = -(local_68[2] == uStack_70a);
  auVar27[0xf] = -(local_68[3] == uStack_709);
  auVar23 = auVar23 & auVar27;
  local_950.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff);
  local_950.m_message.px = (element_type *)0x0;
  local_950.m_message.pn.pi_ = (sp_counted_base *)0x0;
  uStack_620 = &local_930;
  local_930._0_8_ = "merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot";
  local_930.m_message.px = (element_type *)0xe477cd;
  sStack_630.px = (element_type *)(sStack_630._1_8_ << 8);
  local_638 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  sStack_630.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_898 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_890 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_950,(lazy_ostream *)local_638,1,0,WARN,_cVar37,(size_t)&local_898,0x128);
  boost::detail::shared_count::~shared_count(&local_950.m_message.pn);
  local_8a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_8a0 = "";
  local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x129;
  file_04.m_begin = (iterator)&local_8a8;
  msg_04.m_end = pvVar12;
  msg_04.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_8b8,
             msg_04);
  local_638[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((long)local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start >> 5 ==
                 ((long)ppStack_570 - (long)local_578 >> 2) * -0x71c71c71c71c71c7);
  sStack_630.px = (element_type *)0x0;
  sStack_630.pn.pi_ = (sp_counted_base *)0x0;
  local_950._0_8_ = "vMatched.size() == merkleBlock.vMatchedTxn.size()";
  local_950.m_message.px = (element_type *)0xe477ff;
  local_728[8] = 0;
  local_728._0_8_ = &PTR__lazy_ostream_01389048;
  stack0xfffffffffffff8f0 = (lazy_ostream *)&local_950;
  local_718._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_8c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_8c0 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_638,(lazy_ostream *)local_728,1,0,WARN,_cVar37,
             (size_t)&local_8c8,0x129);
  boost::detail::shared_count::~shared_count(&sStack_630.pn);
  if (local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar13 = 1;
    uVar14 = 0;
    do {
      local_8d8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_8d0 = "";
      local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_8e0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_05.m_end = (iterator)0x12b;
      file_05.m_begin = (iterator)&local_8d8;
      msg_05.m_end = pvVar12;
      msg_05.m_begin = pvVar11;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_8e8,
                 msg_05);
      puVar10 = local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start + uVar14;
      auVar17 = *(undefined1 (*) [16])
                 (local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar14].super_base_blob<256U>.m_data._M_elems +
                 0x10);
      puVar1 = &local_578[uVar14].second;
      auVar28[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0] ==
                    (puVar10->super_base_blob<256U>).m_data._M_elems[0]);
      auVar28[1] = -((puVar1->super_base_blob<256U>).m_data._M_elems[1] ==
                    (puVar10->super_base_blob<256U>).m_data._M_elems[1]);
      auVar28[2] = -((puVar1->super_base_blob<256U>).m_data._M_elems[2] ==
                    (puVar10->super_base_blob<256U>).m_data._M_elems[2]);
      auVar28[3] = -((puVar1->super_base_blob<256U>).m_data._M_elems[3] ==
                    (puVar10->super_base_blob<256U>).m_data._M_elems[3]);
      auVar28[4] = -((puVar1->super_base_blob<256U>).m_data._M_elems[4] ==
                    (puVar10->super_base_blob<256U>).m_data._M_elems[4]);
      auVar28[5] = -((puVar1->super_base_blob<256U>).m_data._M_elems[5] ==
                    (puVar10->super_base_blob<256U>).m_data._M_elems[5]);
      auVar28[6] = -((puVar1->super_base_blob<256U>).m_data._M_elems[6] ==
                    (puVar10->super_base_blob<256U>).m_data._M_elems[6]);
      auVar28[7] = -((puVar1->super_base_blob<256U>).m_data._M_elems[7] ==
                    (puVar10->super_base_blob<256U>).m_data._M_elems[7]);
      auVar28[8] = -((puVar1->super_base_blob<256U>).m_data._M_elems[8] ==
                    (puVar10->super_base_blob<256U>).m_data._M_elems[8]);
      auVar28[9] = -((puVar1->super_base_blob<256U>).m_data._M_elems[9] ==
                    (puVar10->super_base_blob<256U>).m_data._M_elems[9]);
      auVar28[10] = -((puVar1->super_base_blob<256U>).m_data._M_elems[10] ==
                     (puVar10->super_base_blob<256U>).m_data._M_elems[10]);
      auVar28[0xb] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      (puVar10->super_base_blob<256U>).m_data._M_elems[0xb]);
      auVar28[0xc] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      (puVar10->super_base_blob<256U>).m_data._M_elems[0xc]);
      auVar28[0xd] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      (puVar10->super_base_blob<256U>).m_data._M_elems[0xd]);
      auVar28[0xe] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      (puVar10->super_base_blob<256U>).m_data._M_elems[0xe]);
      auVar28[0xf] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      (puVar10->super_base_blob<256U>).m_data._M_elems[0xf]);
      puVar2 = local_578[uVar14].second.super_base_blob<256U>.m_data._M_elems + 0x10;
      auVar18[0] = -(*puVar2 == auVar17[0]);
      auVar18[1] = -(puVar2[1] == auVar17[1]);
      auVar18[2] = -(puVar2[2] == auVar17[2]);
      auVar18[3] = -(puVar2[3] == auVar17[3]);
      auVar18[4] = -(puVar2[4] == auVar17[4]);
      auVar18[5] = -(puVar2[5] == auVar17[5]);
      auVar18[6] = -(puVar2[6] == auVar17[6]);
      auVar18[7] = -(puVar2[7] == auVar17[7]);
      auVar18[8] = -(puVar2[8] == auVar17[8]);
      auVar18[9] = -(puVar2[9] == auVar17[9]);
      auVar18[10] = -(puVar2[10] == auVar17[10]);
      auVar18[0xb] = -(puVar2[0xb] == auVar17[0xb]);
      auVar18[0xc] = -(puVar2[0xc] == auVar17[0xc]);
      auVar18[0xd] = -(puVar2[0xd] == auVar17[0xd]);
      auVar18[0xe] = -(puVar2[0xe] == auVar17[0xe]);
      auVar18[0xf] = -(puVar2[0xf] == auVar17[0xf]);
      auVar18 = auVar18 & auVar28;
      local_638[0] = (class_property<bool>)
                     (class_property<bool>)
                     ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff);
      sStack_630.px = (element_type *)0x0;
      sStack_630.pn.pi_ = (sp_counted_base *)0x0;
      local_950._0_8_ = "vMatched[i] == merkleBlock.vMatchedTxn[i].second";
      local_950.m_message.px = (element_type *)0xe47830;
      local_728[8] = 0;
      local_728._0_8_ = &PTR__lazy_ostream_01389048;
      stack0xfffffffffffff8f0 = (lazy_ostream *)&local_950;
      local_718._0_8_ = boost::unit_test::lazy_ostream::inst;
      local_8f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_8f0 = "";
      pvVar11 = (iterator)0x1;
      pvVar12 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_638,(lazy_ostream *)local_728,1,0,WARN,_cVar37,
                 (size_t)&local_8f8,299);
      boost::detail::shared_count::~shared_count(&sStack_630.pn);
      uVar14 = (ulong)uVar13;
      uVar13 = uVar13 + 1;
    } while (uVar14 < (ulong)((long)local_848.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_848.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 5));
  }
  memcpy(local_728,util::hex_literals::detail::Hex<131ul>{std::array<std::byte_65ul>,0x41);
  vKey_00.m_size = 0x41;
  vKey_00.m_data = local_728;
  CBloomFilter::insert(&local_750,vKey_00);
  CMerkleBlock::CMerkleBlock
            ((CMerkleBlock *)local_728,(CBlock *)local_a8,&local_750,
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)0x0);
  puVar8 = (undefined8 *)local_728;
  puVar9 = (undefined8 *)local_618;
  for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar9 = *puVar8;
    puVar8 = puVar8 + (ulong)bVar16 * -2 + 1;
    puVar9 = puVar9 + (ulong)bVar16 * -2 + 1;
  }
  local_5c8.nTransactions = local_6d8;
  if (local_5c8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_5c8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_5c8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_5c8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  puVar4 = local_5c8.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar10 = local_5c8.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_5c8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = local_6b0;
  local_5c8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = local_6c0;
  local_5c8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = local_6d0;
  local_6d0 = (_Bit_type *)0x0;
  uStack_6c8 = 0;
  local_6c0 = (_Bit_type *)0x0;
  uStack_6b8 = 0;
  local_6b0 = (_Bit_pointer)0x0;
  local_5c8.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_6a8._0_8_;
  local_5c8.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_6a8._8_8_;
  local_5c8.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_698;
  local_6a8 = (undefined1  [16])0x0;
  local_698 = (pointer)0x0;
  if (puVar10 != (pointer)0x0) {
    operator_delete(puVar10,(long)puVar4 - (long)puVar10);
  }
  ppVar6 = local_568;
  ppVar5 = local_578;
  local_5c8.fBad = local_690;
  local_578 = (pointer)local_688._0_8_;
  ppStack_570 = (pointer)local_688._8_8_;
  local_568 = local_678;
  local_688 = (undefined1  [16])0x0;
  local_678 = (pointer)0x0;
  if (ppVar5 != (pointer)0x0) {
    operator_delete(ppVar5,(long)ppVar6 - (long)ppVar5);
    if ((pointer)local_688._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_688._0_8_,(long)local_678 - local_688._0_8_);
    }
  }
  if ((pointer)local_6a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_6a8._0_8_,(long)local_698 - local_6a8._0_8_);
  }
  if (local_6d0 != (_Bit_type *)0x0) {
    operator_delete(local_6d0,(long)local_6b0 - (long)local_6d0);
  }
  local_908 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_900 = "";
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  local_910 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x133;
  file_06.m_begin = (iterator)&local_908;
  msg_06.m_end = pvVar12;
  msg_06.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_918,
             msg_06);
  CBlockHeader::GetHash((uint256 *)local_728,(CBlockHeader *)local_618);
  CBlockHeader::GetHash((uint256 *)local_638,(CBlockHeader *)local_a8);
  auVar29[0] = -((uchar)sStack_630.pn.pi_ == local_718[0]);
  auVar29[1] = -(sStack_630.pn.pi_._1_1_ == local_718[1]);
  auVar29[2] = -(sStack_630.pn.pi_._2_1_ == local_718[2]);
  auVar29[3] = -(sStack_630.pn.pi_._3_1_ == local_718[3]);
  auVar29[4] = -(sStack_630.pn.pi_._4_1_ == local_718[4]);
  auVar29[5] = -(sStack_630.pn.pi_._5_1_ == local_718[5]);
  auVar29[6] = -(sStack_630.pn.pi_._6_1_ == local_718[6]);
  auVar29[7] = -(sStack_630.pn.pi_._7_1_ == local_718[7]);
  auVar29[8] = -((uchar)uStack_620 == local_718[8]);
  auVar29[9] = -(uStack_620._1_1_ == uStack_70f);
  auVar29[10] = -(uStack_620._2_1_ == uStack_70e);
  auVar29[0xb] = -(uStack_620._3_1_ == uStack_70d);
  auVar29[0xc] = -(uStack_620._4_1_ == uStack_70c);
  auVar29[0xd] = -(uStack_620._5_1_ == uStack_70b);
  auVar29[0xe] = -(uStack_620._6_1_ == uStack_70a);
  auVar29[0xf] = -(uStack_620._7_1_ == uStack_709);
  auVar24[0] = -(local_638[0] == local_728[0]);
  auVar24[1] = -(local_638[1] == local_728[1]);
  auVar24[2] = -(local_638[2] == local_728[2]);
  auVar24[3] = -(local_638[3] == local_728[3]);
  auVar24[4] = -(local_638[4] == local_728[4]);
  auVar24[5] = -(local_638[5] == local_728[5]);
  auVar24[6] = -(local_638[6] == local_728[6]);
  auVar24[7] = -(local_638[7] == local_728[7]);
  auVar24[8] = -(sStack_630.px._0_1_ == (bool)local_728[8]);
  auVar24[9] = -(sStack_630.px._1_1_ == local_728[9]);
  auVar24[10] = -(sStack_630.px._2_1_ == local_728[10]);
  auVar24[0xb] = -(sStack_630.px._3_1_ == local_728[0xb]);
  auVar24[0xc] = -(sStack_630.px._4_1_ == local_728[0xc]);
  auVar24[0xd] = -(sStack_630.px._5_1_ == local_728[0xd]);
  auVar24[0xe] = -(sStack_630.px._6_1_ == local_728[0xe]);
  auVar24[0xf] = -(sStack_630.px._7_1_ == local_728[0xf]);
  auVar24 = auVar24 & auVar29;
  local_930.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) == 0xffff);
  local_930.m_message.px = (element_type *)0x0;
  local_930.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_938 = &local_960;
  local_960 = "merkleBlock.header.GetHash() == block.GetHash()";
  local_958 = "";
  local_950.m_message.px = (element_type *)(local_950.m_message._1_8_ << 8);
  local_950._0_8_ = &PTR__lazy_ostream_01389048;
  local_950.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_970 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_968 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_930,(lazy_ostream *)&local_950,1,0,WARN,_cVar37,(size_t)&local_970,0x133);
  boost::detail::shared_count::~shared_count(&local_930.m_message.pn);
  local_980 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_978 = "";
  local_990 = &boost::unit_test::basic_cstring<char_const>::null;
  local_988 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x135;
  file_07.m_begin = (iterator)&local_980;
  msg_07.m_end = pvVar12;
  msg_07.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_990,
             msg_07);
  sStack_630.px = (element_type *)0x0;
  sStack_630.pn.pi_ = (sp_counted_base *)0x0;
  local_950._0_8_ = "merkleBlock.vMatchedTxn.size() == 3";
  local_950.m_message.px = (element_type *)0xe47c58;
  local_728[8] = 0;
  local_728._0_8_ = &PTR__lazy_ostream_01389048;
  local_718._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_9a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_998 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_638[0] = (class_property<bool>)
                 (class_property<bool>)((long)ppStack_570 - (long)local_578 == 0x6c);
  unique0x100059db = (lazy_ostream *)&local_950;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_638,(lazy_ostream *)local_728,1,0,WARN,_cVar37,
             (size_t)&local_9a0,0x135);
  boost::detail::shared_count::~shared_count(&sStack_630.pn);
  local_9b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_9a8 = "";
  local_9c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x137;
  file_08.m_begin = (iterator)&local_9b0;
  msg_08.m_end = pvVar12;
  msg_08.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_9c0,
             msg_08);
  if (local_668._0_4_ == local_578->first) {
    auVar30[0] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0] == local_668[4]);
    auVar30[1] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[1] == local_668[5]);
    auVar30[2] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[2] == local_668[6]);
    auVar30[3] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[3] == local_668[7]);
    auVar30[4] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[4] ==
                  (uchar)sStack_660.px);
    auVar30[5] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[5] ==
                  sStack_660.px._1_1_);
    auVar30[6] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[6] ==
                  sStack_660.px._2_1_);
    auVar30[7] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[7] ==
                  sStack_660.px._3_1_);
    auVar30[8] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[8] ==
                  sStack_660.px._4_1_);
    auVar30[9] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[9] ==
                  sStack_660.px._5_1_);
    auVar30[10] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[10] ==
                   sStack_660.px._6_1_);
    auVar30[0xb] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0xb] ==
                    sStack_660.px._7_1_);
    auVar30[0xc] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0xc] ==
                    (uchar)sStack_660.pn.pi_);
    auVar30[0xd] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0xd] ==
                    sStack_660.pn.pi_._1_1_);
    auVar30[0xe] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0xe] ==
                    sStack_660.pn.pi_._2_1_);
    auVar30[0xf] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0xf] ==
                    sStack_660.pn.pi_._3_1_);
    auVar19[0] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x10] ==
                  sStack_660.pn.pi_._4_1_);
    auVar19[1] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x11] ==
                  sStack_660.pn.pi_._5_1_);
    auVar19[2] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x12] ==
                  sStack_660.pn.pi_._6_1_);
    auVar19[3] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x13] ==
                  sStack_660.pn.pi_._7_1_);
    auVar19[4] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x14] == uStack_650);
    auVar19[5] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x15] == uStack_64f);
    auVar19[6] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x16] == uStack_64e);
    auVar19[7] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x17] == uStack_64d);
    auVar19[8] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x18] == uStack_64c);
    auVar19[9] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x19] == uStack_64b);
    auVar19[10] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x1a] == uStack_64a);
    auVar19[0xb] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x1b] == uStack_649);
    auVar19[0xc] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                    (uchar)local_648);
    auVar19[0xd] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                    local_648._1_1_);
    auVar19[0xe] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                    local_648._2_1_);
    auVar19[0xf] = -((local_578->second).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                    local_648._3_1_);
    auVar19 = auVar19 & auVar30;
    local_638[0] = (class_property<bool>)
                   ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    local_638[0] = (class_property<bool>)false;
  }
  sStack_630.px = (element_type *)0x0;
  sStack_630.pn.pi_ = (sp_counted_base *)0x0;
  local_950._0_8_ = "pair == merkleBlock.vMatchedTxn[0]";
  local_950.m_message.px = (element_type *)0xe47a4f;
  local_728[8] = 0;
  local_728._0_8_ = &PTR__lazy_ostream_01389048;
  stack0xfffffffffffff8f0 = (lazy_ostream *)&local_950;
  local_718._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_9d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_9c8 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_638,(lazy_ostream *)local_728,1,0,WARN,_cVar37,
             (size_t)&local_9d0,0x137);
  boost::detail::shared_count::~shared_count(&sStack_630.pn);
  local_9e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_9d8 = "";
  local_9f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x139;
  file_09.m_begin = (iterator)&local_9e0;
  msg_09.m_end = pvVar12;
  msg_09.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_9f0,
             msg_09);
  local_728[8] = true;
  local_728._0_8_ = (_func_int **)0x56ebdcacd3069a5f;
  local_728[9] = '\x1b';
  local_728[10] = 0xfe;
  local_728[0xb] = 0xaa;
  local_728[0xc] = 0x3e;
  local_728[0xd] = 0x8a;
  local_728[0xe] = 0x25;
  local_728[0xf] = 0xe6;
  _local_718 = _DAT_00e47130;
  auVar35[0] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0x10] == DAT_00e47130);
  auVar35[1] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0x11] ==
                DAT_00e47130._1_1_);
  auVar35[2] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0x12] ==
                DAT_00e47130._2_1_);
  auVar35[3] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0x13] ==
                DAT_00e47130._3_1_);
  auVar35[4] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0x14] ==
                DAT_00e47130._4_1_);
  auVar35[5] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0x15] ==
                DAT_00e47130._5_1_);
  auVar35[6] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0x16] ==
                DAT_00e47130._6_1_);
  auVar35[7] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0x17] ==
                DAT_00e47130._7_1_);
  auVar35[8] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0x18] ==
                DAT_00e47130._8_1_);
  auVar35[9] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0x19] ==
                DAT_00e47130._9_1_);
  auVar35[10] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 DAT_00e47130._10_1_);
  auVar35[0xb] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  DAT_00e47130._11_1_);
  auVar35[0xc] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  DAT_00e47130._12_1_);
  auVar35[0xd] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  DAT_00e47130._13_1_);
  auVar35[0xe] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  DAT_00e47130._14_1_);
  auVar35[0xf] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  DAT_00e47130._15_1_);
  auVar31[0] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0] == '_');
  auVar31[1] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[1] == 0x9a);
  auVar31[2] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[2] == '\x06');
  auVar31[3] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[3] == 0xd3);
  auVar31[4] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[4] == 0xac);
  auVar31[5] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[5] == 0xdc);
  auVar31[6] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[6] == 0xeb);
  auVar31[7] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[7] == 'V');
  auVar31[8] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[8] == 0xbe);
  auVar31[9] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[9] == '\x1b');
  auVar31[10] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[10] == 0xfe);
  auVar31[0xb] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0xb] == 0xaa);
  auVar31[0xc] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0xc] == '>');
  auVar31[0xd] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0xd] == 0x8a);
  auVar31[0xe] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0xe] == '%');
  auVar31[0xf] = -(local_578[1].second.super_base_blob<256U>.m_data._M_elems[0xf] == 0xe6);
  auVar31 = auVar31 & auVar35;
  local_950.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) == 0xffff);
  local_950.m_message.px = (element_type *)0x0;
  local_950.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_930._0_8_ =
       "merkleBlock.vMatchedTxn[1].second == uint256{\"28204cad1d7fc1d199e8ef4fa22f182de6258a3eaafe1bbe56ebdcacd3069a5f\"}"
  ;
  local_930.m_message.px = (element_type *)0xe47ac0;
  sStack_630.px = (element_type *)(sStack_630._1_8_ << 8);
  local_638 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  sStack_630.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_9f8 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  uStack_620 = &local_930;
  boost::test_tools::tt_detail::report_assertion
            (&local_950,(lazy_ostream *)local_638,1,0,WARN,_cVar37,(size_t)&local_a00,0x139);
  boost::detail::shared_count::~shared_count(&local_950.m_message.pn);
  local_a10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_a08 = "";
  local_a20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a18 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x13a;
  file_10.m_begin = (iterator)&local_a10;
  msg_10.m_end = pvVar12;
  msg_10.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_a20,
             msg_10);
  local_638[0] = (class_property<bool>)(class_property<bool>)(local_578[1].first == 1);
  sStack_630.px = (element_type *)0x0;
  sStack_630.pn.pi_ = (sp_counted_base *)0x0;
  local_950._0_8_ = "merkleBlock.vMatchedTxn[1].first == 1";
  local_950.m_message.px = (element_type *)0xe47ae6;
  local_728[8] = 0;
  local_728._0_8_ = &PTR__lazy_ostream_01389048;
  stack0xfffffffffffff8f0 = (lazy_ostream *)&local_950;
  local_718._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_a30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_a28 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_638,(lazy_ostream *)local_728,1,0,WARN,_cVar37,
             (size_t)&local_a30,0x13a);
  boost::detail::shared_count::~shared_count(&sStack_630.pn);
  local_a40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_a38 = "";
  local_a50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a48 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x13c;
  file_11.m_begin = (iterator)&local_a40;
  msg_11.m_end = pvVar12;
  msg_11.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_a50,
             msg_11);
  local_728[8] = true;
  local_728._0_8_ = (_func_int **)0x7663ace63cddb23;
  local_728[9] = 'm';
  local_728[10] = 4;
  local_728[0xb] = 0xb4;
  local_728[0xc] = 0xd8;
  local_728[0xd] = 3;
  local_728[0xe] = 0xe4;
  local_728[0xf] = 0x84;
  _local_718 = _DAT_00e47170;
  auVar36[0] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0x10] == DAT_00e47170);
  auVar36[1] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0x11] ==
                DAT_00e47170._1_1_);
  auVar36[2] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0x12] ==
                DAT_00e47170._2_1_);
  auVar36[3] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0x13] ==
                DAT_00e47170._3_1_);
  auVar36[4] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0x14] ==
                DAT_00e47170._4_1_);
  auVar36[5] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0x15] ==
                DAT_00e47170._5_1_);
  auVar36[6] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0x16] ==
                DAT_00e47170._6_1_);
  auVar36[7] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0x17] ==
                DAT_00e47170._7_1_);
  auVar36[8] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0x18] ==
                DAT_00e47170._8_1_);
  auVar36[9] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0x19] ==
                DAT_00e47170._9_1_);
  auVar36[10] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 DAT_00e47170._10_1_);
  auVar36[0xb] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  DAT_00e47170._11_1_);
  auVar36[0xc] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  DAT_00e47170._12_1_);
  auVar36[0xd] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  DAT_00e47170._13_1_);
  auVar36[0xe] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  DAT_00e47170._14_1_);
  auVar36[0xf] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  DAT_00e47170._15_1_);
  auVar32[0] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0] == '#');
  auVar32[1] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[1] == 0xdb);
  auVar32[2] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[2] == 0xcd);
  auVar32[3] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[3] == 'c');
  auVar32[4] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[4] == 0xce);
  auVar32[5] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[5] == ':');
  auVar32[6] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[6] == 'f');
  auVar32[7] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[7] == '\a');
  auVar32[8] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[8] == 'p');
  auVar32[9] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[9] == 'm');
  auVar32[10] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[10] == '\x04');
  auVar32[0xb] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0xb] == 0xb4);
  auVar32[0xc] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0xc] == 0xd8);
  auVar32[0xd] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0xd] == '\x03');
  auVar32[0xe] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0xe] == 0xe4);
  auVar32[0xf] = -(local_578[2].second.super_base_blob<256U>.m_data._M_elems[0xf] == 0x84);
  auVar32 = auVar32 & auVar36;
  local_950.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) == 0xffff);
  local_950.m_message.px = (element_type *)0x0;
  local_950.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_930._0_8_ =
       "merkleBlock.vMatchedTxn[2].second == uint256{\"3c1d7e82342158e4109df2e0b6348b6e84e403d8b4046d7007663ace63cddb23\"}"
  ;
  local_930.m_message.px = (element_type *)0xe47cc9;
  sStack_630.px = (element_type *)(sStack_630._1_8_ << 8);
  local_638 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  sStack_630.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_a58 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  uStack_620 = &local_930;
  boost::test_tools::tt_detail::report_assertion
            (&local_950,(lazy_ostream *)local_638,1,0,WARN,_cVar37,(size_t)&local_a60,0x13c);
  boost::detail::shared_count::~shared_count(&local_950.m_message.pn);
  local_a70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_a68 = "";
  local_a80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a78 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x13d;
  file_12.m_begin = (iterator)&local_a70;
  msg_12.m_end = pvVar12;
  msg_12.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_a80,
             msg_12);
  local_638[0] = (class_property<bool>)(class_property<bool>)(local_578[2].first == 3);
  sStack_630.px = (element_type *)0x0;
  sStack_630.pn.pi_ = (sp_counted_base *)0x0;
  local_950._0_8_ = "merkleBlock.vMatchedTxn[2].first == 3";
  local_950.m_message.px = (element_type *)0xe47cef;
  local_728[8] = 0;
  local_728._0_8_ = &PTR__lazy_ostream_01389048;
  stack0xfffffffffffff8f0 = (lazy_ostream *)&local_950;
  local_718._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_a90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_a88 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_638,(lazy_ostream *)local_728,1,0,WARN,_cVar37,
             (size_t)&local_a90,0x13d);
  boost::detail::shared_count::~shared_count(&sStack_630.pn);
  local_aa0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_a98 = "";
  local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_aa8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x13f;
  file_13.m_begin = (iterator)&local_aa0;
  msg_13.m_end = pvVar12;
  msg_13.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_ab0,
             msg_13);
  CPartialMerkleTree::ExtractMatches
            ((uint256 *)local_728,&local_5c8,&local_848,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_868);
  auVar25[0] = -((class_property<bool>)local_88[4] == local_728[0]);
  auVar25[1] = -(local_88[5] == local_728[1]);
  auVar25[2] = -(local_88[6] == local_728[2]);
  auVar25[3] = -(local_88[7] == local_728[3]);
  auVar25[4] = -(local_88[8] == local_728[4]);
  auVar25[5] = -(local_88[9] == local_728[5]);
  auVar25[6] = -(local_88[10] == local_728[6]);
  auVar25[7] = -(local_88[0xb] == local_728[7]);
  auVar25[8] = -(local_88[0xc] == local_728[8]);
  auVar25[9] = -(local_88[0xd] == local_728[9]);
  auVar25[10] = -(local_88[0xe] == local_728[10]);
  auVar25[0xb] = -(local_88[0xf] == local_728[0xb]);
  auVar25[0xc] = -(local_78[0] == local_728[0xc]);
  auVar25[0xd] = -(local_78[1] == local_728[0xd]);
  auVar25[0xe] = -(local_78[2] == local_728[0xe]);
  auVar25[0xf] = -(local_78[3] == local_728[0xf]);
  auVar33[0] = -(local_78[4] == local_718[0]);
  auVar33[1] = -(local_78[5] == local_718[1]);
  auVar33[2] = -(local_78[6] == local_718[2]);
  auVar33[3] = -(local_78[7] == local_718[3]);
  auVar33[4] = -(local_78[8] == local_718[4]);
  auVar33[5] = -(local_78[9] == local_718[5]);
  auVar33[6] = -(local_78[10] == local_718[6]);
  auVar33[7] = -(local_78[0xb] == local_718[7]);
  auVar33[8] = -(local_78[0xc] == local_718[8]);
  auVar33[9] = -(local_78[0xd] == uStack_70f);
  auVar33[10] = -(local_78[0xe] == uStack_70e);
  auVar33[0xb] = -(local_78[0xf] == uStack_70d);
  auVar33[0xc] = -(local_68[0] == uStack_70c);
  auVar33[0xd] = -(local_68[1] == uStack_70b);
  auVar33[0xe] = -(local_68[2] == uStack_70a);
  auVar33[0xf] = -(local_68[3] == uStack_709);
  auVar25 = auVar25 & auVar33;
  local_950.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff);
  local_950.m_message.px = (element_type *)0x0;
  local_950.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_930._0_8_ = "merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot";
  local_930.m_message.px = (element_type *)0xe477cd;
  sStack_630.px = (element_type *)(sStack_630._1_8_ << 8);
  local_638 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  sStack_630.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_ac0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_ab8 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  uStack_620 = &local_930;
  boost::test_tools::tt_detail::report_assertion
            (&local_950,(lazy_ostream *)local_638,1,0,WARN,_cVar37,(size_t)&local_ac0,0x13f);
  boost::detail::shared_count::~shared_count(&local_950.m_message.pn);
  local_ad0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_ac8 = "";
  local_ae0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ad8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x140;
  file_14.m_begin = (iterator)&local_ad0;
  msg_14.m_end = pvVar12;
  msg_14.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_ae0,
             msg_14);
  local_638[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((long)local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start >> 5 ==
                 ((long)ppStack_570 - (long)local_578 >> 2) * -0x71c71c71c71c71c7);
  sStack_630.px = (element_type *)0x0;
  sStack_630.pn.pi_ = (sp_counted_base *)0x0;
  local_950._0_8_ = "vMatched.size() == merkleBlock.vMatchedTxn.size()";
  local_950.m_message.px = (element_type *)0xe477ff;
  local_728[8] = 0;
  local_728._0_8_ = &PTR__lazy_ostream_01389048;
  stack0xfffffffffffff8f0 = (lazy_ostream *)&local_950;
  local_718._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_af0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_ae8 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_638,(lazy_ostream *)local_728,1,0,WARN,_cVar37,
             (size_t)&local_af0,0x140);
  boost::detail::shared_count::~shared_count(&sStack_630.pn);
  if (local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar14 = 0;
    uVar15 = 1;
    do {
      local_b00 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_af8 = "";
      local_b10 = &boost::unit_test::basic_cstring<char_const>::null;
      local_b08 = &boost::unit_test::basic_cstring<char_const>::null;
      file_15.m_end = (iterator)0x142;
      file_15.m_begin = (iterator)&local_b00;
      msg_15.m_end = pvVar12;
      msg_15.m_begin = pvVar11;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_b10,
                 msg_15);
      puVar10 = local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start + uVar14;
      auVar17 = *(undefined1 (*) [16])
                 (local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar14].super_base_blob<256U>.m_data._M_elems +
                 0x10);
      puVar1 = &local_578[uVar14].second;
      auVar34[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0] ==
                    (puVar10->super_base_blob<256U>).m_data._M_elems[0]);
      auVar34[1] = -((puVar1->super_base_blob<256U>).m_data._M_elems[1] ==
                    (puVar10->super_base_blob<256U>).m_data._M_elems[1]);
      auVar34[2] = -((puVar1->super_base_blob<256U>).m_data._M_elems[2] ==
                    (puVar10->super_base_blob<256U>).m_data._M_elems[2]);
      auVar34[3] = -((puVar1->super_base_blob<256U>).m_data._M_elems[3] ==
                    (puVar10->super_base_blob<256U>).m_data._M_elems[3]);
      auVar34[4] = -((puVar1->super_base_blob<256U>).m_data._M_elems[4] ==
                    (puVar10->super_base_blob<256U>).m_data._M_elems[4]);
      auVar34[5] = -((puVar1->super_base_blob<256U>).m_data._M_elems[5] ==
                    (puVar10->super_base_blob<256U>).m_data._M_elems[5]);
      auVar34[6] = -((puVar1->super_base_blob<256U>).m_data._M_elems[6] ==
                    (puVar10->super_base_blob<256U>).m_data._M_elems[6]);
      auVar34[7] = -((puVar1->super_base_blob<256U>).m_data._M_elems[7] ==
                    (puVar10->super_base_blob<256U>).m_data._M_elems[7]);
      auVar34[8] = -((puVar1->super_base_blob<256U>).m_data._M_elems[8] ==
                    (puVar10->super_base_blob<256U>).m_data._M_elems[8]);
      auVar34[9] = -((puVar1->super_base_blob<256U>).m_data._M_elems[9] ==
                    (puVar10->super_base_blob<256U>).m_data._M_elems[9]);
      auVar34[10] = -((puVar1->super_base_blob<256U>).m_data._M_elems[10] ==
                     (puVar10->super_base_blob<256U>).m_data._M_elems[10]);
      auVar34[0xb] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      (puVar10->super_base_blob<256U>).m_data._M_elems[0xb]);
      auVar34[0xc] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      (puVar10->super_base_blob<256U>).m_data._M_elems[0xc]);
      auVar34[0xd] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      (puVar10->super_base_blob<256U>).m_data._M_elems[0xd]);
      auVar34[0xe] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      (puVar10->super_base_blob<256U>).m_data._M_elems[0xe]);
      auVar34[0xf] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      (puVar10->super_base_blob<256U>).m_data._M_elems[0xf]);
      puVar2 = local_578[uVar14].second.super_base_blob<256U>.m_data._M_elems + 0x10;
      auVar20[0] = -(*puVar2 == auVar17[0]);
      auVar20[1] = -(puVar2[1] == auVar17[1]);
      auVar20[2] = -(puVar2[2] == auVar17[2]);
      auVar20[3] = -(puVar2[3] == auVar17[3]);
      auVar20[4] = -(puVar2[4] == auVar17[4]);
      auVar20[5] = -(puVar2[5] == auVar17[5]);
      auVar20[6] = -(puVar2[6] == auVar17[6]);
      auVar20[7] = -(puVar2[7] == auVar17[7]);
      auVar20[8] = -(puVar2[8] == auVar17[8]);
      auVar20[9] = -(puVar2[9] == auVar17[9]);
      auVar20[10] = -(puVar2[10] == auVar17[10]);
      auVar20[0xb] = -(puVar2[0xb] == auVar17[0xb]);
      auVar20[0xc] = -(puVar2[0xc] == auVar17[0xc]);
      auVar20[0xd] = -(puVar2[0xd] == auVar17[0xd]);
      auVar20[0xe] = -(puVar2[0xe] == auVar17[0xe]);
      auVar20[0xf] = -(puVar2[0xf] == auVar17[0xf]);
      auVar20 = auVar20 & auVar34;
      local_638[0] = (class_property<bool>)
                     (class_property<bool>)
                     ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff);
      sStack_630.px = (element_type *)0x0;
      sStack_630.pn.pi_ = (sp_counted_base *)0x0;
      local_950._0_8_ = "vMatched[i] == merkleBlock.vMatchedTxn[i].second";
      local_950.m_message.px = (element_type *)0xe47830;
      local_728[8] = 0;
      local_728._0_8_ = &PTR__lazy_ostream_01389048;
      stack0xfffffffffffff8f0 = (lazy_ostream *)&local_950;
      local_718._0_8_ = boost::unit_test::lazy_ostream::inst;
      pvVar11 = (iterator)0x1;
      pvVar12 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_638,(lazy_ostream *)local_728,1,0,WARN,0xe471ec,
                 (size_t)&stack0xfffffffffffff4e0,0x142);
      boost::detail::shared_count::~shared_count(&sStack_630.pn);
      bVar3 = uVar15 < (ulong)((long)local_848.super__Vector_base<uint256,_std::allocator<uint256>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_848.super__Vector_base<uint256,_std::allocator<uint256>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
      uVar14 = uVar15;
      uVar15 = (ulong)((int)uVar15 + 1);
    } while (bVar3);
  }
  puVar10 = local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((pointer)local_868._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_868._0_8_,(long)local_858 - local_868._0_8_);
    puVar10 = local_848.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (puVar10 != (pointer)0x0) {
    operator_delete(puVar10,(long)local_848.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar10)
    ;
  }
  if (local_578 != (pointer)0x0) {
    operator_delete(local_578,(long)local_568 - (long)local_578);
  }
  if (local_5c8.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5c8.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_5c8.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5c8.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_5c8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_5c8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_5c8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_5c8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_750.vData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_750.vData.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_750.vData.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_750.vData.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_770);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_block_2_with_update_none)
{
    // Random real block (000000005a4ded781e667e06ceefafb71410b511fe0d5adc3e5a27ecbec34ae6)
    // With 4 txes
    CBlock block;
    DataStream stream{
        "0100000075616236cc2126035fadb38deb65b9102cc2c41c09cdf29fc051906800000000fe7d5e12ef0ff901f6050211249919b1c0653771832b3a80c66cea42847f0ae1d4d26e49ffff001d00f0a4410401000000010000000000000000000000000000000000000000000000000000000000000000ffffffff0804ffff001d029105ffffffff0100f2052a010000004341046d8709a041d34357697dfcb30a9d05900a6294078012bf3bb09c6f9b525f1d16d5503d7905db1ada9501446ea00728668fc5719aa80be2fdfc8a858a4dbdd4fbac00000000010000000255605dc6f5c3dc148b6da58442b0b2cd422be385eab2ebea4119ee9c268d28350000000049483045022100aa46504baa86df8a33b1192b1b9367b4d729dc41e389f2c04f3e5c7f0559aae702205e82253a54bf5c4f65b7428551554b2045167d6d206dfe6a2e198127d3f7df1501ffffffff55605dc6f5c3dc148b6da58442b0b2cd422be385eab2ebea4119ee9c268d2835010000004847304402202329484c35fa9d6bb32a55a70c0982f606ce0e3634b69006138683bcd12cbb6602200c28feb1e2555c3210f1dddb299738b4ff8bbe9667b68cb8764b5ac17b7adf0001ffffffff0200e1f505000000004341046a0765b5865641ce08dd39690aade26dfbf5511430ca428a3089261361cef170e3929a68aee3d8d4848b0c5111b0a37b82b86ad559fd2a745b44d8e8d9dfdc0cac00180d8f000000004341044a656f065871a353f216ca26cef8dde2f03e8c16202d2e8ad769f02032cb86a5eb5e56842e92e19141d60a01928f8dd2c875a390f67c1f6c94cfc617c0ea45afac0000000001000000025f9a06d3acdceb56be1bfeaa3e8a25e62d182fa24fefe899d1c17f1dad4c2028000000004847304402205d6058484157235b06028c30736c15613a28bdb768ee628094ca8b0030d4d6eb0220328789c9a2ec27ddaec0ad5ef58efded42e6ea17c2e1ce838f3d6913f5e95db601ffffffff5f9a06d3acdceb56be1bfeaa3e8a25e62d182fa24fefe899d1c17f1dad4c2028010000004a493046022100c45af050d3cea806cedd0ab22520c53ebe63b987b8954146cdca42487b84bdd6022100b9b027716a6b59e640da50a864d6dd8a0ef24c76ce62391fa3eabaf4d2886d2d01ffffffff0200e1f505000000004341046a0765b5865641ce08dd39690aade26dfbf5511430ca428a3089261361cef170e3929a68aee3d8d4848b0c5111b0a37b82b86ad559fd2a745b44d8e8d9dfdc0cac00180d8f000000004341046a0765b5865641ce08dd39690aade26dfbf5511430ca428a3089261361cef170e3929a68aee3d8d4848b0c5111b0a37b82b86ad559fd2a745b44d8e8d9dfdc0cac000000000100000002e2274e5fea1bf29d963914bd301aa63b64daaf8a3e88f119b5046ca5738a0f6b0000000048473044022016e7a727a061ea2254a6c358376aaa617ac537eb836c77d646ebda4c748aac8b0220192ce28bf9f2c06a6467e6531e27648d2b3e2e2bae85159c9242939840295ba501ffffffffe2274e5fea1bf29d963914bd301aa63b64daaf8a3e88f119b5046ca5738a0f6b010000004a493046022100b7a1a755588d4190118936e15cd217d133b0e4a53c3c15924010d5648d8925c9022100aaef031874db2114f2d869ac2de4ae53908fbfea5b2b1862e181626bb9005c9f01ffffffff0200e1f505000000004341044a656f065871a353f216ca26cef8dde2f03e8c16202d2e8ad769f02032cb86a5eb5e56842e92e19141d60a01928f8dd2c875a390f67c1f6c94cfc617c0ea45afac00180d8f000000004341046a0765b5865641ce08dd39690aade26dfbf5511430ca428a3089261361cef170e3929a68aee3d8d4848b0c5111b0a37b82b86ad559fd2a745b44d8e8d9dfdc0cac00000000"_hex,
    };
    stream >> TX_WITH_WITNESS(block);

    CBloomFilter filter(10, 0.000001, 0, BLOOM_UPDATE_NONE);
    // Match the first transaction
    filter.insert(uint256{"e980fe9f792d014e73b95203dc1335c5f9ce19ac537a419e6df5b47aecb93b70"});

    CMerkleBlock merkleBlock(block, filter);
    BOOST_CHECK(merkleBlock.header.GetHash() == block.GetHash());

    BOOST_CHECK(merkleBlock.vMatchedTxn.size() == 1);
    std::pair<unsigned int, uint256> pair = merkleBlock.vMatchedTxn[0];

    BOOST_CHECK(merkleBlock.vMatchedTxn[0].second == uint256{"e980fe9f792d014e73b95203dc1335c5f9ce19ac537a419e6df5b47aecb93b70"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[0].first == 0);

    std::vector<uint256> vMatched;
    std::vector<unsigned int> vIndex;
    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);

    // Match an output from the second transaction (the pubkey for address 1DZTzaBHUDM7T3QvUKBz4qXMRpkg8jsfB5)
    // This should not match the third transaction though it spends the output matched
    // It will match the fourth transaction, which has another pay-to-pubkey output to the same address
    filter.insert("044a656f065871a353f216ca26cef8dde2f03e8c16202d2e8ad769f02032cb86a5eb5e56842e92e19141d60a01928f8dd2c875a390f67c1f6c94cfc617c0ea45af"_hex_u8);

    merkleBlock = CMerkleBlock(block, filter);
    BOOST_CHECK(merkleBlock.header.GetHash() == block.GetHash());

    BOOST_CHECK(merkleBlock.vMatchedTxn.size() == 3);

    BOOST_CHECK(pair == merkleBlock.vMatchedTxn[0]);

    BOOST_CHECK(merkleBlock.vMatchedTxn[1].second == uint256{"28204cad1d7fc1d199e8ef4fa22f182de6258a3eaafe1bbe56ebdcacd3069a5f"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[1].first == 1);

    BOOST_CHECK(merkleBlock.vMatchedTxn[2].second == uint256{"3c1d7e82342158e4109df2e0b6348b6e84e403d8b4046d7007663ace63cddb23"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[2].first == 3);

    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);
}